

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_rewrite_module.c
# Opt level: O0

char * ngx_http_rewrite_value(ngx_conf_t *cf,ngx_http_rewrite_loc_conf_t *lcf,ngx_str_t *value)

{
  undefined8 *puVar1;
  ngx_int_t nVar2;
  ngx_http_script_complex_value_code_t *complex;
  ngx_http_script_value_code_t *val;
  ngx_http_script_compile_t sc;
  ngx_int_t n;
  ngx_str_t *value_local;
  ngx_http_rewrite_loc_conf_t *lcf_local;
  ngx_conf_t *cf_local;
  
  sc._80_8_ = ngx_http_script_variables_count(value);
  if (sc._80_8_ == 0) {
    puVar1 = (undefined8 *)ngx_http_script_start_code(cf->pool,&lcf->codes,0x20);
    if (puVar1 == (undefined8 *)0x0) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      sc._80_8_ = ngx_atoi(value->data,value->len);
      if (sc._80_8_ == -1) {
        sc._80_8_ = 0;
      }
      *puVar1 = ngx_http_script_value_code;
      puVar1[1] = sc._80_8_;
      puVar1[2] = value->len;
      puVar1[3] = value->data;
      cf_local = (ngx_conf_t *)0x0;
    }
  }
  else {
    puVar1 = (undefined8 *)ngx_http_script_start_code(cf->pool,&lcf->codes,0x10);
    if (puVar1 == (undefined8 *)0x0) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      *puVar1 = ngx_http_script_complex_value_code;
      puVar1[1] = 0;
      memset(&val,0,0x58);
      sc.flushes = (ngx_array_t **)(puVar1 + 1);
      sc.values = (ngx_array_t **)sc._80_8_;
      sc.main._0_1_ = (byte)sc.main & 0xfd | 2;
      val = (ngx_http_script_value_code_t *)cf;
      sc.cf = (ngx_conf_t *)value;
      sc.lengths = &lcf->codes;
      nVar2 = ngx_http_script_compile((ngx_http_script_compile_t *)&val);
      if (nVar2 == 0) {
        cf_local = (ngx_conf_t *)0x0;
      }
      else {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
    }
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_rewrite_value(ngx_conf_t *cf, ngx_http_rewrite_loc_conf_t *lcf,
    ngx_str_t *value)
{
    ngx_int_t                              n;
    ngx_http_script_compile_t              sc;
    ngx_http_script_value_code_t          *val;
    ngx_http_script_complex_value_code_t  *complex;

    n = ngx_http_script_variables_count(value);

    if (n == 0) {
        val = ngx_http_script_start_code(cf->pool, &lcf->codes,
                                         sizeof(ngx_http_script_value_code_t));
        if (val == NULL) {
            return NGX_CONF_ERROR;
        }

        n = ngx_atoi(value->data, value->len);

        if (n == NGX_ERROR) {
            n = 0;
        }

        val->code = ngx_http_script_value_code;
        val->value = (uintptr_t) n;
        val->text_len = (uintptr_t) value->len;
        val->text_data = (uintptr_t) value->data;

        return NGX_CONF_OK;
    }

    complex = ngx_http_script_start_code(cf->pool, &lcf->codes,
                                 sizeof(ngx_http_script_complex_value_code_t));
    if (complex == NULL) {
        return NGX_CONF_ERROR;
    }

    complex->code = ngx_http_script_complex_value_code;
    complex->lengths = NULL;

    ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

    sc.cf = cf;
    sc.source = value;
    sc.lengths = &complex->lengths;
    sc.values = &lcf->codes;
    sc.variables = n;
    sc.complete_lengths = 1;

    if (ngx_http_script_compile(&sc) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}